

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O3

bool __thiscall wasm::WATParser::anon_unknown_10::LexIntCtx::takeHexdigit(LexIntCtx *this)

{
  size_t *psVar1;
  char cVar2;
  int iVar3;
  ulong uVar4;
  string_view sVar5;
  
  if ((this->super_LexCtx).input._M_len == (this->super_LexCtx).lexedSize) {
    return false;
  }
  sVar5 = LexCtx::next(&this->super_LexCtx);
  cVar2 = *sVar5._M_str;
  iVar3 = (int)cVar2;
  if ((byte)(cVar2 - 0x30U) < 10) {
    iVar3 = iVar3 + -0x30;
  }
  else if ((byte)(cVar2 + 0xbfU) < 6) {
    iVar3 = iVar3 + -0x37;
  }
  else {
    if (5 < (byte)(cVar2 + 0x9fU)) {
      return false;
    }
    iVar3 = iVar3 + -0x57;
  }
  psVar1 = &(this->super_LexCtx).lexedSize;
  *psVar1 = *psVar1 + 1;
  uVar4 = (long)iVar3 + this->n * 0x10;
  if (uVar4 < this->n) {
    this->overflow = true;
  }
  this->n = uVar4;
  return true;
}

Assistant:

bool takeHexdigit() {
    if (!empty()) {
      if (auto h = getHexDigit(peek())) {
        take(1);
        uint64_t newN = n * 16 + *h;
        if (newN < n) {
          overflow = true;
        }
        n = newN;
        return true;
      }
    }
    return false;
  }